

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

int mbedtls_mpi_core_random
              (mbedtls_mpi_uint *X,mbedtls_mpi_uint min,mbedtls_mpi_uint *N,size_t limbs,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  mbedtls_ct_condition_t mVar4;
  mbedtls_ct_condition_t mVar5;
  long lVar6;
  size_t count;
  ulong uVar7;
  int iVar8;
  size_t n_bytes;
  
  uVar7 = limbs & 0xffffffff;
  lVar6 = uVar7 * 0x40 + 0x47;
  lVar3 = uVar7 * 0x40 + 0x40;
  n_bytes = 0;
  do {
    if ((int)uVar7 < 1) {
      iVar8 = 0xfa;
      count = 0;
      goto LAB_01cf57b3;
    }
    uVar1 = N[uVar7 - 1];
    uVar7 = uVar7 - 1;
    lVar6 = lVar6 + -0x40;
    lVar3 = lVar3 + -0x40;
  } while (uVar1 == 0);
  uVar7 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = uVar7 ^ 0x3f;
  n_bytes = (lVar3 - uVar7) + 7 >> 3;
  iVar8 = 0xfa;
  if (0x20 < lVar3 - uVar7) {
    iVar8 = 0x1e;
  }
  count = ((lVar6 - uVar7 & 0x3ffffffff8) + uVar7) - lVar3;
LAB_01cf57b3:
  while( true ) {
    iVar2 = mbedtls_mpi_core_fill_random(X,limbs,n_bytes,f_rng,p_rng);
    if (iVar2 != 0) {
      return iVar2;
    }
    mbedtls_mpi_core_shift_r(X,limbs,count);
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) break;
    mVar4 = mbedtls_mpi_core_uint_le_mpi(min,X,limbs);
    mVar5 = mbedtls_mpi_core_lt_ct(X,N,limbs);
    if ((mVar5 & mVar4) != mbedtls_ct_zero) {
      return 0;
    }
  }
  return -0xe;
}

Assistant:

int mbedtls_mpi_core_random(mbedtls_mpi_uint *X,
                            mbedtls_mpi_uint min,
                            const mbedtls_mpi_uint *N,
                            size_t limbs,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng)
{
    mbedtls_ct_condition_t ge_lower = MBEDTLS_CT_TRUE, lt_upper = MBEDTLS_CT_FALSE;
    size_t n_bits = mbedtls_mpi_core_bitlen(N, limbs);
    size_t n_bytes = (n_bits + 7) / 8;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /*
     * When min == 0, each try has at worst a probability 1/2 of failing
     * (the msb has a probability 1/2 of being 0, and then the result will
     * be < N), so after 30 tries failure probability is a most 2**(-30).
     *
     * When N is just below a power of 2, as is the case when generating
     * a random scalar on most elliptic curves, 1 try is enough with
     * overwhelming probability. When N is just above a power of 2,
     * as when generating a random scalar on secp224k1, each try has
     * a probability of failing that is almost 1/2.
     *
     * The probabilities are almost the same if min is nonzero but negligible
     * compared to N. This is always the case when N is crypto-sized, but
     * it's convenient to support small N for testing purposes. When N
     * is small, use a higher repeat count, otherwise the probability of
     * failure is macroscopic.
     */
    int count = (n_bytes > 4 ? 30 : 250);

    /*
     * Match the procedure given in RFC 6979 §3.3 (deterministic ECDSA)
     * when f_rng is a suitably parametrized instance of HMAC_DRBG:
     * - use the same byte ordering;
     * - keep the leftmost n_bits bits of the generated octet string;
     * - try until result is in the desired range.
     * This also avoids any bias, which is especially important for ECDSA.
     */
    do {
        MBEDTLS_MPI_CHK(mbedtls_mpi_core_fill_random(X, limbs,
                                                     n_bytes,
                                                     f_rng, p_rng));
        mbedtls_mpi_core_shift_r(X, limbs, 8 * n_bytes - n_bits);

        if (--count == 0) {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            goto cleanup;
        }

        ge_lower = mbedtls_mpi_core_uint_le_mpi(min, X, limbs);
        lt_upper = mbedtls_mpi_core_lt_ct(X, N, limbs);
    } while (mbedtls_ct_bool_and(ge_lower, lt_upper) == MBEDTLS_CT_FALSE);

cleanup:
    return ret;
}